

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall ON_DimStyle::SetDimTextAngleStyle(ON_DimStyle *this,ContentAngleStyle style)

{
  ContentAngleStyle style_local;
  ON_DimStyle *this_local;
  
  if (this->m_dim_text_angle_style != style) {
    this->m_dim_text_angle_style = style;
    Internal_TextPositionPropertiesChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,DimTextAngleStyle);
  return;
}

Assistant:

void ON_DimStyle::SetDimTextAngleStyle(ON_DimStyle::ContentAngleStyle style)
{
  if (m_dim_text_angle_style != style)
  {
    m_dim_text_angle_style = style;
    Internal_TextPositionPropertiesChange();
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::DimTextAngleStyle);
}